

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

iter_type __thiscall
booster::locale::impl_icu::num_parse<char>::do_real_get<long_double>
          (num_parse<char> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          longdouble *val)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  ios_info *this_00;
  uint64_t uVar8;
  ulong uVar9;
  streambuf_type *psVar10;
  ulong uVar11;
  streambuf_type *psVar12;
  bool bVar13;
  iter_type iVar14;
  undefined1 auVar15 [12];
  _func_int **local_70;
  base_formatter local_68;
  num_parse<char> *local_60;
  string_type tmp;
  cast_type value;
  
  psVar10 = end._M_sbuf;
  psVar12 = in._M_sbuf;
  uVar6 = end._M_c;
  uVar5 = in._M_c;
  local_60 = this;
  plVar7 = (long *)__dynamic_cast(ios,&std::ios_base::typeinfo,&std::istream::typeinfo,
                                  0xffffffffffffffff);
  bVar13 = true;
  if (plVar7 == (long *)0x0) {
    local_70 = (_func_int **)0x0;
    bVar2 = false;
  }
  else {
    this_00 = ios_info::get(ios);
    uVar8 = ios_info::display_flags(this_00);
    if (uVar8 == 0) {
      local_70 = (_func_int **)0x0;
      bVar2 = false;
      bVar13 = true;
    }
    else {
      formatter<char>::create((formatter<char> *)&local_68,ios,&local_60->loc_,&local_60->enc_);
      local_70 = local_68._vptr_base_formatter;
      local_68._vptr_base_formatter = (_func_int **)0x0;
      bVar13 = local_70 == (_func_int **)0x0;
      bVar2 = true;
    }
  }
  if ((bVar2) && (local_68._vptr_base_formatter != (_func_int **)0x0)) {
    (**(code **)(*local_68._vptr_base_formatter + 8))();
  }
  if (!bVar13) {
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)&tmp);
    while( true ) {
      uVar3 = uVar5;
      if (uVar5 == 0xffffffff && psVar12 != (streambuf_type *)0x0) {
        if (*(byte **)(psVar12 + 0x10) < *(byte **)(psVar12 + 0x18)) {
          uVar3 = (uint)**(byte **)(psVar12 + 0x10);
        }
        else {
          uVar3 = (**(code **)(*(long *)psVar12 + 0x48))(psVar12);
        }
        if (uVar3 == 0xffffffff) {
          psVar12 = (streambuf_type *)0x0;
        }
      }
      uVar4 = uVar6;
      if (psVar10 != (streambuf_type *)0x0 && uVar6 == 0xffffffff) {
        if (*(byte **)(psVar10 + 0x10) < *(byte **)(psVar10 + 0x18)) {
          uVar4 = (uint)**(byte **)(psVar10 + 0x10);
        }
        else {
          uVar4 = (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
        }
        if (uVar4 == 0xffffffff) {
          psVar10 = (streambuf_type *)0x0;
        }
      }
      if ((uVar4 == 0xffffffff) == (uVar3 == 0xffffffff)) break;
      uVar3 = uVar5;
      if (psVar12 != (streambuf_type *)0x0 && uVar5 == 0xffffffff) {
        if (*(byte **)(psVar12 + 0x10) < *(byte **)(psVar12 + 0x18)) {
          uVar3 = (uint)**(byte **)(psVar12 + 0x10);
        }
        else {
          uVar3 = (**(code **)(*(long *)psVar12 + 0x48))(psVar12);
        }
        if (uVar3 == 0xffffffff) {
          psVar12 = (streambuf_type *)0x0;
        }
      }
      if ((char)uVar3 != '\x7f' && 0x1f < (byte)((char)uVar3 - 1U)) break;
      if (*(ulong *)(psVar12 + 0x10) < *(ulong *)(psVar12 + 0x18)) {
        *(ulong *)(psVar12 + 0x10) = *(ulong *)(psVar12 + 0x10) + 1;
        uVar5 = 0xffffffff;
      }
      else {
        uVar5 = 0xffffffff;
        (**(code **)(*(long *)psVar12 + 0x50))(psVar12);
      }
    }
    do {
      if (0xfff < tmp._M_string_length) goto LAB_001916fb;
      uVar3 = uVar5;
      if (uVar5 == 0xffffffff && psVar12 != (streambuf_type *)0x0) {
        if (*(byte **)(psVar12 + 0x10) < *(byte **)(psVar12 + 0x18)) {
          uVar3 = (uint)**(byte **)(psVar12 + 0x10);
        }
        else {
          uVar3 = (**(code **)(*(long *)psVar12 + 0x48))(psVar12);
        }
        if (uVar3 == 0xffffffff) {
          psVar12 = (streambuf_type *)0x0;
        }
      }
      uVar4 = uVar6;
      if (psVar10 != (streambuf_type *)0x0 && uVar6 == 0xffffffff) {
        if (*(byte **)(psVar10 + 0x10) < *(byte **)(psVar10 + 0x18)) {
          uVar4 = (uint)**(byte **)(psVar10 + 0x10);
        }
        else {
          uVar4 = (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
        }
        if (uVar4 == 0xffffffff) {
          psVar10 = (streambuf_type *)0x0;
        }
      }
      if ((uVar3 == 0xffffffff) == (uVar4 == 0xffffffff)) goto LAB_001916fb;
      if (psVar12 != (streambuf_type *)0x0 && uVar5 == 0xffffffff) {
        if (*(byte **)(psVar12 + 0x10) < *(byte **)(psVar12 + 0x18)) {
          uVar5 = (uint)**(byte **)(psVar12 + 0x10);
        }
        else {
          uVar5 = (**(code **)(*(long *)psVar12 + 0x48))(psVar12);
        }
        if (uVar5 == 0xffffffff) {
          psVar12 = (streambuf_type *)0x0;
        }
      }
      if ((char)uVar5 == '\n') goto LAB_001916fb;
      pbVar1 = *(byte **)(psVar12 + 0x10);
      if (pbVar1 < *(byte **)(psVar12 + 0x18)) {
        uVar5 = (uint)*pbVar1;
        *(byte **)(psVar12 + 0x10) = pbVar1 + 1;
      }
      else {
        uVar5 = (**(code **)(*(long *)psVar12 + 0x50))(psVar12);
      }
      if (((psVar12 != (streambuf_type *)0x0) && (uVar5 == 0xffffffff)) &&
         (*(ulong *)(psVar12 + 0x18) <= *(ulong *)(psVar12 + 0x10))) {
        (**(code **)(*(long *)psVar12 + 0x48))(psVar12);
      }
      uVar5 = 0xffffffff;
      std::__cxx11::string::push_back((char)&tmp);
    } while( true );
  }
  auVar15 = std::num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>>::do_get
                      (local_60,psVar12,uVar5,psVar10,end._8_8_ & 0xffffffff,ios,err,val);
  psVar12 = auVar15._0_8_;
  uVar11 = (ulong)auVar15._8_4_;
LAB_001917df:
  if (local_70 != (_func_int **)0x0) {
    (**(code **)(*local_70 + 8))(local_70);
  }
  iVar14._8_8_ = uVar11;
  iVar14._M_sbuf = psVar12;
  return iVar14;
LAB_001916fb:
  uVar9 = (**(code **)(*local_70 + 0x28))(local_70,&tmp,&value);
  uVar11 = tmp._M_string_length;
  if (uVar9 == 0) {
    *(undefined1 *)err = (char)*err | _S_failbit;
  }
  else {
    *val = (longdouble)value;
  }
  for (; uVar9 < uVar11; uVar11 = uVar11 - 1) {
    std::istream::putback((char)plVar7);
  }
  psVar12 = *(streambuf_type **)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0xe8);
  if (psVar12 == (streambuf_type *)0x0) {
    bVar13 = true;
  }
  else {
    if (*(byte **)(psVar12 + 0x10) < *(byte **)(psVar12 + 0x18)) {
      uVar5 = (uint)**(byte **)(psVar12 + 0x10);
    }
    else {
      uVar5 = (**(code **)(*(long *)psVar12 + 0x48))(psVar12);
    }
    bVar13 = uVar5 == 0xffffffff;
    if (bVar13) {
      psVar12 = (streambuf_type *)0x0;
    }
  }
  if (psVar10 != (streambuf_type *)0x0 && uVar6 == 0xffffffff) {
    if (*(byte **)(psVar10 + 0x10) < *(byte **)(psVar10 + 0x18)) {
      uVar6 = (uint)**(byte **)(psVar10 + 0x10);
    }
    else {
      uVar6 = (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
    }
  }
  if ((bool)(bVar13 ^ uVar6 != 0xffffffff)) {
    *(undefined1 *)err = (char)*err | _S_eofbit;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tmp._M_dataplus._M_p != &tmp.field_2) {
    operator_delete(tmp._M_dataplus._M_p);
  }
  uVar11 = 0xffffffff;
  goto LAB_001917df;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }